

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolver_test.c
# Opt level: O2

void test_google_dns(void)

{
  uint16_t uVar1;
  nng_err nVar2;
  int iVar3;
  char *pcVar4;
  short local_d0;
  uint16_t local_ce;
  int local_cc;
  nng_sockaddr sa;
  char *pcStack_40;
  undefined8 local_38;
  short *local_30;
  nni_aio *local_28;
  nng_aio *aio;
  
  pcStack_40 = "google-public-dns-a.google.com";
  local_38 = 0x50;
  local_30 = &local_d0;
  sa.s_storage.sa_pad[0xf] = 0x100000003;
  nVar2 = nng_aio_alloc(&local_28,(_func_void_void_ptr *)0x0,(void *)0x0);
  pcVar4 = nng_strerror(nVar2);
  iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/resolver_test.c"
                         ,0x33,"%s: expected success, got %s (%d)","nng_aio_alloc(&aio, NULL, NULL)"
                         ,pcVar4,nVar2);
  if (iVar3 != 0) {
    nni_resolv((nni_resolv_item *)(sa.s_ipc.sa_path + 0x7e),local_28);
    nng_aio_wait(local_28);
    nVar2 = nng_aio_result(local_28);
    pcVar4 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/resolver_test.c"
                           ,0x36,"%s: expected success, got %s (%d)","nng_aio_result(aio)",pcVar4,
                           nVar2);
    if (iVar3 != 0) {
      iVar3 = acutest_check_((uint)(local_d0 == 3),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/resolver_test.c"
                             ,0x37,"%s","sa.s_in.sa_family == NNG_AF_INET");
      uVar1 = nuts_be16((uint16_t)iVar3);
      acutest_check_((uint)(local_ce == uVar1),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/resolver_test.c"
                     ,0x38,"%s","sa.s_in.sa_port == nuts_be16(80)");
      acutest_check_((uint)(local_cc == 0x8080808),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/resolver_test.c"
                     ,0x39,"%s","sa.s_in.sa_addr == 0x08080808");
      nng_aio_free(local_28);
      return;
    }
  }
  acutest_abort_();
}

Assistant:

void
test_google_dns(void)
{
	nng_aio        *aio;
	nng_sockaddr    sa;
	nni_resolv_item item = { 0 };

	item.ri_host    = "google-public-dns-a.google.com";
	item.ri_port    = 80;
	item.ri_passive = true;
	item.ri_sa      = &sa;
	item.ri_family  = NNG_AF_INET;

	NUTS_PASS(nng_aio_alloc(&aio, NULL, NULL));
	nni_resolv(&item, aio);
	nng_aio_wait(aio);
	NUTS_PASS(nng_aio_result(aio));
	NUTS_TRUE(sa.s_in.sa_family == NNG_AF_INET);
	NUTS_TRUE(sa.s_in.sa_port == nuts_be16(80));
	NUTS_TRUE(sa.s_in.sa_addr == 0x08080808); // aka 8.8.8.8
	nng_aio_free(aio);
}